

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O0

void __thiscall FIX::FieldMap::addField(FieldMap *this,FieldBase *field)

{
  bool bVar1;
  int tag;
  const_iterator local_30;
  __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_28;
  __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_20;
  iterator iter;
  FieldBase *field_local;
  FieldMap *this_local;
  
  iter._M_current = field;
  tag = FieldBase::getTag(field);
  local_20._M_current = (FieldBase *)findPositionFor(this,tag);
  local_28._M_current =
       (FieldBase *)
       std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::end
                 ((vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_> *)(this + 8));
  bVar1 = __gnu_cxx::operator==(&local_20,&local_28);
  if (bVar1) {
    std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::push_back
              ((vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_> *)(this + 8),iter._M_current
              );
  }
  else {
    __gnu_cxx::
    __normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>
    ::__normal_iterator<FIX::FieldBase*>
              ((__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>
                *)&local_30,&local_20);
    std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::insert
              ((vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_> *)(this + 8),local_30,
               iter._M_current);
  }
  return;
}

Assistant:

void addField(const FieldBase &field) {
    Fields::iterator iter = findPositionFor(field.getTag());
    if (iter == m_fields.end()) {
      m_fields.push_back(field);
    } else {
      m_fields.insert(iter, field);
    }
  }